

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_create(void *hint,nn_sockbase **sockbase)

{
  void *pvVar1;
  undefined8 *in_RSI;
  nn_sockbase_vfptr *in_RDI;
  nn_req *self;
  
  pvVar1 = nn_alloc_(0x13fcc8);
  if (pvVar1 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
            ,0x282);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_req_init(self,in_RDI,in_RSI);
  *in_RSI = pvVar1;
  return 0;
}

Assistant:

static int nn_req_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_req *self;

    self = nn_alloc (sizeof (struct nn_req), "socket (req)");
    alloc_assert (self);
    nn_req_init (self, &nn_req_sockbase_vfptr, hint);
    *sockbase = &self->xreq.sockbase;

    return 0;
}